

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_primitive_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::RepeatedPrimitiveFieldGenerator::GenerateParsingCode
          (RepeatedPrimitiveFieldGenerator *this,Printer *printer)

{
  io::Printer::Print(printer,&this->variables_,
                     "if (!$get_mutable_bit_parser$) {\n  $name$_ = new java.util.ArrayList<$boxed_type$>();\n  $set_mutable_bit_parser$;\n}\n$name$_.add(input.read$capitalized_type$());\n"
                    );
  return;
}

Assistant:

void RepeatedPrimitiveFieldGenerator::
GenerateParsingCode(io::Printer* printer) const {
  printer->Print(variables_,
    "if (!$get_mutable_bit_parser$) {\n"
    "  $name$_ = new java.util.ArrayList<$boxed_type$>();\n"
    "  $set_mutable_bit_parser$;\n"
    "}\n"
    "$name$_.add(input.read$capitalized_type$());\n");
}